

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::TemplatedIndexOfHelper<false,Js::TypedArrayBase,unsigned_int>
              (TypedArrayBase *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  uint i;
  Var local_38;
  Var element;
  
  local_38 = (Var)0x0;
  bVar1 = TaggedInt::Is(search);
  do {
    if (toIndex <= fromIndex) {
      return &DAT_10000ffffffff;
    }
    BVar3 = TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
                      ((RecyclableObject *)pArr,fromIndex,&local_38,scriptContext,true);
    if (BVar3 != 0) {
      if ((bVar1) && (bVar2 = TaggedInt::Is(local_38), bVar2)) {
        if (local_38 == search) {
LAB_00a69870:
          pvVar4 = JavascriptNumber::ToVar(fromIndex,scriptContext);
          return pvVar4;
        }
      }
      else {
        BVar3 = JavascriptOperators::StrictEqual(local_38,search,scriptContext);
        if (BVar3 != 0) goto LAB_00a69870;
      }
    }
    fromIndex = fromIndex + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }